

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

IndexPair __thiscall
slang::IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u>::
modifyRoot<slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::Compilation::NetAlias_const*,8u,true>,slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::Compilation::NetAlias_const*,8u,false>,true>
          (IntervalMap<unsigned_long,slang::ast::Compilation::NetAlias_const*,0u> *this,
          LeafNode<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_8U,_true> *rootNode,
          uint32_t position,allocator_type *alloc)

{
  interval<unsigned_long> *piVar1;
  unsigned_long *puVar2;
  uint32_t uVar3;
  ulong uVar4;
  ulong uVar5;
  unsigned_long uVar6;
  IndexPair IVar7;
  LeafNode<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_8U,_false> *pLVar8;
  undefined8 *puVar9;
  ulong uVar10;
  uint uVar11;
  uint32_t uVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  bool bVar16;
  uint32_t sizes [2];
  NodeRef nodes [2];
  uint32_t local_50 [2];
  ulong local_48 [3];
  
  IVar7 = IntervalMapDetails::distribute(2,*(uint32_t *)(this + 0xc4),8,local_50,position);
  local_48[0] = 0;
  local_48[1] = 0;
  uVar11 = 0;
  lVar15 = 0;
  do {
    pLVar8 = PoolAllocator<char,192ul,64ul>::
             emplace<slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::Compilation::NetAlias_const*,8u,false>>
                       ((PoolAllocator<char,192ul,64ul> *)alloc);
    uVar3 = local_50[lVar15];
    if (uVar3 != 0) {
      lVar13 = 0;
      uVar14 = uVar11;
      uVar12 = uVar3;
      do {
        piVar1 = (rootNode->
                 super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Compilation::NetAlias_*,_8U>
                 ).first + uVar14;
        uVar6 = piVar1->right;
        puVar2 = (unsigned_long *)
                 ((long)&(pLVar8->
                         super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Compilation::NetAlias_*,_8U>
                         ).first[0].left + lVar13 * 2);
        *puVar2 = piVar1->left;
        puVar2[1] = uVar6;
        *(NetAlias **)
         ((long)(pLVar8->
                super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Compilation::NetAlias_*,_8U>
                ).second + lVar13) =
             (rootNode->
             super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Compilation::NetAlias_*,_8U>
             ).second[uVar14];
        uVar14 = uVar14 + 1;
        lVar13 = lVar13 + 8;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
    }
    uVar11 = uVar11 + uVar3;
    local_48[lVar15] = (ulong)pLVar8 & 0xffffffffffffffc0 | (ulong)(uVar3 - 1);
    bVar16 = lVar15 == 0;
    lVar15 = lVar15 + 1;
  } while (bVar16);
  memset(this,0,0xc0);
  lVar15 = 0;
  do {
    uVar4 = local_48[lVar15];
    puVar9 = (undefined8 *)(uVar4 & 0xffffffffffffffc0);
    uVar10 = puVar9[1];
    if (1 < (ulong)local_50[lVar15]) {
      lVar13 = 0;
      do {
        uVar5 = *(ulong *)((long)puVar9 + lVar13 + 0x18);
        if (uVar10 <= uVar5) {
          uVar10 = uVar5;
        }
        lVar13 = lVar13 + 0x10;
      } while ((ulong)local_50[lVar15] * 0x10 + -0x10 != lVar13);
    }
    *(undefined8 *)(this + lVar15 * 0x10 + 0x40) = *puVar9;
    *(ulong *)(this + lVar15 * 0x10 + 0x48) = uVar10;
    *(ulong *)(this + lVar15 * 8) = uVar4;
    bVar16 = lVar15 == 0;
    lVar15 = lVar15 + 1;
  } while (bVar16);
  *(undefined4 *)(this + 0xc4) = 2;
  *(int *)(this + 0xc0) = *(int *)(this + 0xc0) + 1;
  return IVar7;
}

Assistant:

IntervalMapDetails::IndexPair IntervalMap<TKey, TValue, N>::modifyRoot(TRootNode& rootNode,
                                                                       uint32_t position,
                                                                       allocator_type& alloc) {
    using namespace IntervalMapDetails;

    // Split the root branch node into two new nodes.
    constexpr uint32_t NumNodes = 2;
    uint32_t sizes[NumNodes];
    IndexPair newOffset = distribute(NumNodes, rootSize, Leaf::Capacity, sizes, position);

    // Construct new nodes.
    uint32_t pos = 0;
    NodeRef nodes[NumNodes];
    for (uint32_t i = 0; i < NumNodes; i++) {
        auto newNode = alloc.template emplace<TNewNode>();
        uint32_t size = sizes[i];

        newNode->copy(rootNode, pos, 0, size);
        nodes[i] = NodeRef(newNode, size);
        pos += size;
    }

    if (SwitchToBranch) {
        // Destroy the old root leaf and switch it to a branch node.
        rootLeaf.~RootLeaf();
        new (&rootBranch) RootBranch();
    }

    for (uint32_t i = 0; i < NumNodes; i++) {
        rootBranch.keyAt(i) = nodes[i].template get<TNewNode>().getBounds(sizes[i]);
        rootBranch.childAt(i) = nodes[i];
    }

    rootSize = NumNodes;
    height++;
    return newOffset;
}